

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

bool __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::has_label_value
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *label_value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  size_t size;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> arr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  ulong local_80;
  size_type local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [2];
  _Alloc_hider local_18;
  undefined1 local_1;
  
  local_18._M_p = (pointer)in_RSI;
  memset(local_58,0,0x40);
  pbVar1 = local_58;
  do {
    local_b0 = pbVar1;
    std::__cxx11::string::string(in_RDI);
    pbVar1 = local_b0 + 1;
  } while (local_b0 + 1 !=
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffe8);
  local_68 = 2;
  local_70 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_18._M_p);
  puVar3 = std::min<unsigned_long>(&local_68,&local_70);
  local_60 = *puVar3;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_18._M_p);
  if (sVar4 < 3) {
    for (local_80 = 0; local_80 < local_60; local_80 = local_80 + 1) {
      in_stack_ffffffffffffff30 =
           (dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_18._M_p,local_80);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    std::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
    ::span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                *)in_stack_ffffffffffffff30,
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                *)in_stack_ffffffffffffff28);
    dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::find
              (in_stack_ffffffffffffff30,
               (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                )local_b0);
    bVar2 = std::operator==((shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
                             *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_1 = (bVar2 ^ 0xffU) & 1;
    std::
    shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair>
    ::~shared_ptr((shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
                   *)0x1eff39);
  }
  else {
    local_1 = 0;
  }
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *)in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool has_label_value(const std::vector<std::string> &label_value) override {
    std::array<std::string, N> arr{};
    size_t size = (std::min)((size_t)N, label_value.size());
    if (label_value.size() > N) {
      return false;
    }

    for (size_t i = 0; i < size; i++) {
      arr[i] = label_value[i];
    }
    return Base::find(arr) != nullptr;
  }